

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
GlobOpt::TypeSpecializeFloatBinary
          (GlobOpt *this,Instr *instr,Value *src1Val,Value *src2Val,Value **pDstVal)

{
  OpCode OVar1;
  Opnd *this_00;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  uint sourceContextId;
  uint functionId;
  FloatConstantValueInfo *pFVar5;
  Value *pVVar6;
  RegOpnd *pRVar7;
  undefined4 *puVar8;
  char16 *pcVar9;
  BailOutKind bailOutKind;
  ValueInfo *pVVar10;
  bool bVar11;
  
  if ((this->field_0xf5 & 0x20) == 0) {
    return false;
  }
  bVar3 = OpCodeAttr::IsInlineBuiltIn(instr->m_opcode);
  OVar1 = instr->m_opcode;
  if (bVar3) {
    if (OVar1 != InlineArrayPush) {
      bailOutKind = BailOutPrimitiveButString;
LAB_00438a76:
      bVar4 = false;
      bVar11 = false;
      goto LAB_00438a78;
    }
    bVar3 = ValueInfo::IsFloatConstant(src2Val->valueInfo);
    if (bVar3) {
      pFVar5 = ValueInfo::AsFloatConstant(src2Val->valueInfo);
      bVar3 = (undefined1 *)pFVar5->floatValue == &DAT_fff80002fff80002;
    }
    else {
      bVar3 = false;
    }
    bVar4 = ValueType::IsLikelyNumber(&src2Val->valueInfo->super_ValueType);
    bVar11 = false;
    if (bVar3) {
      return false;
    }
    if (!bVar4) {
      return false;
    }
    bailOutKind = BailOutNumberOnly;
    bVar3 = true;
    goto LAB_00438b57;
  }
  bailOutKind = BailOutPrimitiveButString;
  switch(OVar1) {
  case Add_A:
    if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) {
      return false;
    }
    bVar3 = ValueType::IsLikelyNumber(&src1Val->valueInfo->super_ValueType);
    if (!bVar3) {
      return false;
    }
    bVar3 = ValueType::IsLikelyNumber(&src2Val->valueInfo->super_ValueType);
    bVar4 = false;
    bVar11 = false;
    bailOutKind = BailOutPrimitiveButString;
    if (!bVar3) {
      return false;
    }
    break;
  case Div_A:
  case Mul_A:
  case Sub_A:
  case Expo_A:
    bVar3 = ValueType::IsNotNumber(&src1Val->valueInfo->super_ValueType);
    if (bVar3) {
      return false;
    }
    pVVar10 = src2Val->valueInfo;
    goto LAB_00438b18;
  case ProfiledDiv_A:
  case Rem_A:
  case ProfiledRem_A:
  case And_A:
  case Or_A:
  case Xor_A:
  case Shl_A:
  case Shr_A:
  case ShrU_A:
    goto switchD_00438ad2_caseD_2f;
  case CmEq_A:
  case CmNeq_A:
  case CmSrEq_A:
  case CmSrNeq_A:
    bVar3 = ValueType::IsNotNumber(&src1Val->valueInfo->super_ValueType);
    if (bVar3) {
      return false;
    }
    bVar3 = ValueType::IsNotNumber(&src2Val->valueInfo->super_ValueType);
    bVar4 = false;
    if (bVar3) {
      return false;
    }
    bailOutKind = BailOutNumberOnly;
    bVar11 = true;
    break;
  case CmGe_A:
  case CmGt_A:
  case CmLt_A:
  case CmLe_A:
    bVar3 = ValueType::IsNotNumber(&src1Val->valueInfo->super_ValueType);
    if (bVar3) {
      return false;
    }
    bVar3 = ValueType::IsNotNumber(&src2Val->valueInfo->super_ValueType);
    bVar11 = true;
    goto LAB_00438c45;
  default:
    if (3 < OVar1 - 0x10) {
      if (3 < OVar1 - 0x194) {
        if (OVar1 - 0x198 < 4) goto LAB_00438af7;
        if ((1 < OVar1 - 0xc) && (1 < OVar1 - 0x14)) {
          bVar4 = true;
          bVar11 = false;
          if (OVar1 != ArgOut_A_InlineBuiltIn) {
            return false;
          }
          break;
        }
      }
      bVar3 = ValueType::IsNotNumber(&src1Val->valueInfo->super_ValueType);
      if ((bVar3) || (bVar3 = ValueType::IsNotNumber(&src2Val->valueInfo->super_ValueType), bVar3))
      {
switchD_00438ad2_caseD_2f:
        return false;
      }
      bailOutKind = BailOutNumberOnly;
      goto LAB_00438a76;
    }
LAB_00438af7:
    bVar3 = ValueType::IsNotNumber(&src1Val->valueInfo->super_ValueType);
    if (bVar3) {
      return false;
    }
    pVVar10 = src2Val->valueInfo;
LAB_00438b18:
    bVar3 = ValueType::IsNotNumber(&pVVar10->super_ValueType);
    bVar11 = false;
LAB_00438c45:
    bVar4 = false;
    bailOutKind = BailOutPrimitiveButString;
    if (bVar3 != false) {
      return false;
    }
  }
LAB_00438a78:
  ToFloat64(this,instr,instr->m_src1,this->currentBlock,src1Val,(IndirOpnd *)0x0,bailOutKind);
  bVar3 = false;
  if (!bVar4) {
LAB_00438b57:
    ToFloat64(this,instr,instr->m_src2,this->currentBlock,src2Val,(IndirOpnd *)0x0,bailOutKind);
    if ((!bVar3) && (this_00 = instr->m_dst, this_00 != (Opnd *)0x0)) {
      if (bVar11) {
        pVVar6 = CreateDstUntransferredValue(this,(ValueType)0x400,instr,src1Val,src2Val);
        *pDstVal = pVVar6;
        pRVar7 = IR::Opnd::AsRegOpnd(this_00);
        ToVarRegOpnd(this,pRVar7,this->currentBlock);
      }
      else {
        pVVar6 = CreateDstUntransferredValue(this,(ValueType)0x108,instr,src1Val,src2Val);
        *pDstVal = pVVar6;
        bVar3 = IR::Opnd::IsRegOpnd(this_00);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x2ab7,"(dst->IsRegOpnd())","What else?");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar8 = 0;
        }
        pRVar7 = IR::Opnd::AsRegOpnd(this_00);
        ToFloat64Dst(this,instr,pRVar7,this->currentBlock);
      }
    }
  }
  sourceContextId = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,GlobOptPhase,sourceContextId,functionId);
  if (bVar3) {
    Output::Print(L"TRACE ");
    if (this->prePassLoop != (Loop *)0x0) {
      Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                    (ulong)(this->prePassLoop->loopNumber - 1));
    }
    Output::Print(L": ");
    Output::Print(L"Type specialized to FLOAT: ");
    IR::Instr::Dump(instr);
    Output::Flush();
  }
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,FloatTypeSpecPhase);
  if (!bVar3) {
    return true;
  }
  Output::Print(L"Type specialized to FLOAT: ");
  pcVar9 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
  Output::Print(L"%s \n",pcVar9);
  return true;
}

Assistant:

bool
GlobOpt::TypeSpecializeFloatBinary(IR::Instr *instr, Value *src1Val, Value *src2Val, Value **pDstVal)
{
    IR::Opnd *src1;
    IR::Opnd *src2;
    IR::Opnd *dst;
    bool allowUndefinedOrNullSrc1 = true;
    bool allowUndefinedOrNullSrc2 = true;

    bool skipSrc1 = false;
    bool skipSrc2 = false;
    bool skipDst = false;
    bool convertDstToBool = false;

    if (!this->DoFloatTypeSpec())
    {
        return false;
    }

    // For inline built-ins we need to do type specialization. Check upfront to avoid duplicating same case labels.
    if (!OpCodeAttr::IsInlineBuiltIn(instr->m_opcode))
    {
        switch (instr->m_opcode)
        {
        case Js::OpCode::Sub_A:
        case Js::OpCode::Mul_A:
        case Js::OpCode::Div_A:
        case Js::OpCode::Expo_A:
            // Avoid if one source is known not to be a number.
            if (src1Val->GetValueInfo()->IsNotNumber() || src2Val->GetValueInfo()->IsNotNumber())
            {
                return false;
            }
            break;

        case Js::OpCode::BrSrEq_A:
        case Js::OpCode::BrSrNeq_A:
        case Js::OpCode::BrEq_A:
        case Js::OpCode::BrNeq_A:
        case Js::OpCode::BrSrNotEq_A:
        case Js::OpCode::BrNotEq_A:
        case Js::OpCode::BrSrNotNeq_A:
        case Js::OpCode::BrNotNeq_A:
            // Avoid if one source is known not to be a number.
            if (src1Val->GetValueInfo()->IsNotNumber() || src2Val->GetValueInfo()->IsNotNumber())
            {
                return false;
            }
            // Undef == Undef, but +Undef != +Undef
            // 0.0 != null, but 0.0 == +null
            //
            // So Bailout on anything but numbers for both src1 and src2
            allowUndefinedOrNullSrc1 = false;
            allowUndefinedOrNullSrc2 = false;
            break;

        case Js::OpCode::BrGt_A:
        case Js::OpCode::BrGe_A:
        case Js::OpCode::BrLt_A:
        case Js::OpCode::BrLe_A:
        case Js::OpCode::BrNotGt_A:
        case Js::OpCode::BrNotGe_A:
        case Js::OpCode::BrNotLt_A:
        case Js::OpCode::BrNotLe_A:
            // Avoid if one source is known not to be a number.
            if (src1Val->GetValueInfo()->IsNotNumber() || src2Val->GetValueInfo()->IsNotNumber())
            {
                return false;
            }
            break;

        case Js::OpCode::Add_A:
            // For Add, we need both sources to be Numbers, otherwise it could be a string concat
            if (!src1Val || !src2Val || !(src1Val->GetValueInfo()->IsLikelyNumber() && src2Val->GetValueInfo()->IsLikelyNumber()))
            {
                return false;
            }
            break;

        case Js::OpCode::ArgOut_A_InlineBuiltIn:
            skipSrc2 = true;
            skipDst = true;
            break;

        case Js::OpCode::CmEq_A:
        case Js::OpCode::CmSrEq_A:
        case Js::OpCode::CmNeq_A:
        case Js::OpCode::CmSrNeq_A:
        {
            if (src1Val->GetValueInfo()->IsNotNumber() || src2Val->GetValueInfo()->IsNotNumber())
            {
                return false;
            }

            allowUndefinedOrNullSrc1 = false;
            allowUndefinedOrNullSrc2 = false;
            convertDstToBool = true;
            break;
        }

        case Js::OpCode::CmLe_A:
        case Js::OpCode::CmLt_A:
        case Js::OpCode::CmGe_A:
        case Js::OpCode::CmGt_A:
        {
            if (src1Val->GetValueInfo()->IsNotNumber() || src2Val->GetValueInfo()->IsNotNumber())
            {
                return false;
            }

            convertDstToBool = true;
            break;
        }
        
        default:
            return false;
        }
    }
    else
    {
        switch (instr->m_opcode)
        {
            case Js::OpCode::InlineArrayPush:
                bool isFloatConstMissingItem = src2Val->GetValueInfo()->IsFloatConstant();

                if(isFloatConstMissingItem)
                {
                    FloatConstType floatValue = src2Val->GetValueInfo()->AsFloatConstant()->FloatValue();
                    isFloatConstMissingItem = Js::SparseArraySegment<double>::IsMissingItem(&floatValue);
                }
                // Don't specialize if the element is not likelyNumber - we will surely bailout
                if(!(src2Val->GetValueInfo()->IsLikelyNumber()) || isFloatConstMissingItem)
                {
                    return false;
                }
                // Only specialize the Second source - element
                skipSrc1 = true;
                skipDst = true;
                allowUndefinedOrNullSrc2 = false;
                break;
        }
    }

    // Make sure the srcs are specialized
    if(!skipSrc1)
    {
        src1 = instr->GetSrc1();
        this->ToFloat64(instr, src1, this->currentBlock, src1Val, nullptr, (allowUndefinedOrNullSrc1 ? IR::BailOutPrimitiveButString : IR::BailOutNumberOnly));
    }

    if (!skipSrc2)
    {
        src2 = instr->GetSrc2();
        this->ToFloat64(instr, src2, this->currentBlock, src2Val, nullptr, (allowUndefinedOrNullSrc2 ? IR::BailOutPrimitiveButString : IR::BailOutNumberOnly));
    }

    if (!skipDst)
    {
        dst = instr->GetDst();
        if (dst)
        {
            if (convertDstToBool)
            {
                *pDstVal = CreateDstUntransferredValue(ValueType::Boolean, instr, src1Val, src2Val);
                ToVarRegOpnd(dst->AsRegOpnd(), currentBlock);
            }
            else
            {
                *pDstVal = CreateDstUntransferredValue(ValueType::Float, instr, src1Val, src2Val);
                AssertMsg(dst->IsRegOpnd(), "What else?");
                this->ToFloat64Dst(instr, dst->AsRegOpnd(), this->currentBlock);
            }
        }
    }

    GOPT_TRACE_INSTR(instr, _u("Type specialized to FLOAT: "));

#if ENABLE_DEBUG_CONFIG_OPTIONS
    if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::FloatTypeSpecPhase))
    {
        Output::Print(_u("Type specialized to FLOAT: "));
        Output::Print(_u("%s \n"), Js::OpCodeUtil::GetOpCodeName(instr->m_opcode));
    }
#endif

    return true;
}